

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::BeginGlobal
          (BinaryReaderObjdump *this,Index index,Type type,bool mutable_)

{
  ObjdumpState *pOVar1;
  pointer pbVar2;
  undefined4 in_EAX;
  char *pcVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  size_type sVar5;
  undefined8 in_R9;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  
  uVar7 = CONCAT44(type.enum_,in_EAX);
  pcVar3 = Type::GetName((Type *)&stack0xffffffffffffffdc);
  _Var6._M_p = (pointer)0x0;
  PrintDetails(this," - global[%u] %s mutable=%d",(ulong)index,pcVar3,
               CONCAT71(in_register_00000009,mutable_) & 0xffffffff,in_R9,uVar7);
  pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
  uVar4 = (ulong)index;
  pbVar2 = (pOVar1->global_names).names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = 0;
  if (uVar4 < (ulong)((long)(pOVar1->global_names).names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    _Var6._M_p = pbVar2[uVar4]._M_dataplus._M_p;
    sVar5 = pbVar2[uVar4]._M_string_length;
  }
  if (sVar5 != 0) {
    PrintDetails(this," <%.*s>",sVar5,_Var6._M_p);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginGlobal(Index index, Type type, bool mutable_) {
  PrintDetails(" - global[%" PRIindex "] %s mutable=%d", index, type.GetName(),
               mutable_);
  string_view name = GetGlobalName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  return Result::Ok;
}